

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29931::TestOutOfCoreCHECKMacrosCanFailTests::RunImpl
          (TestOutOfCoreCHECKMacrosCanFailTests *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_54;
  ScopedCurrentTest scopedResult;
  TestDetails local_40;
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResult,&results,(TestDetails *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x73);
  UnitTest::TestResults::OnTestFailure(pTVar1,&local_40,"false");
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResult);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  scopedResult.m_oldTestResults._0_4_ = 1;
  local_54 = UnitTest::TestResults::GetFailureCount(&results);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x7e);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&scopedResult,&local_54,&local_40);
  return;
}

Assistant:

TEST(OutOfCoreCHECKMacrosCanFailTests)
{
	TestResults results;
	{
		ScopedCurrentTest scopedResult(results);
		Fail();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}